

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::posix_part_file::free_piece(posix_part_file *this,piece_index_t piece)

{
  iterator __position;
  __node_base_ptr p_Var1;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  __it;
  key_type local_1c;
  
  __it._M_cur = (__node_type *)0x0;
  local_1c.m_val = piece.m_val;
  p_Var1 = ::std::
           _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_piece_map)._M_h,
                      (ulong)(long)piece.m_val % (this->m_piece_map)._M_h._M_bucket_count,&local_1c,
                      (long)piece.m_val);
  if (p_Var1 != (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)p_Var1->_M_nxt;
  }
  if (__it._M_cur != (__node_type *)0x0) {
    __position._M_current =
         (this->m_free_slots).
         super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_free_slots).
        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
      ::
      _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>const&>
                ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
                  *)&this->m_free_slots,__position,
                 (strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> *)
                 ((long)__it._M_cur + 0xc));
    }
    else {
      (__position._M_current)->m_val =
           ((strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> *)
           ((long)__it._M_cur + 0xc))->m_val;
      (this->m_free_slots).
      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    ::std::
    _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::erase(&(this->m_piece_map)._M_h,(const_iterator)__it._M_cur);
    this->m_dirty_metadata = true;
  }
  return;
}

Assistant:

void posix_part_file::free_piece(piece_index_t const piece)
	{
		auto const i = m_piece_map.find(piece);
		if (i == m_piece_map.end()) return;

		// TODO: what do we do if someone is currently reading from the disk
		// from this piece? does it matter? Since we won't actively erase the
		// data from disk, but it may be overwritten soon, it's probably not that
		// big of a deal

		m_free_slots.push_back(i->second);
		m_piece_map.erase(i);
		m_dirty_metadata = true;
	}